

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  bool bVar1;
  Type TVar2;
  Result RVar3;
  char *format;
  long lVar4;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  char *local_b8;
  size_type sStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  undefined8 uStack_a0;
  Type type;
  undefined4 uStack_94;
  Token token;
  string local_38 [32];
  
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    Consume(&token,this);
    TVar2 = Token::type(&token);
    _type = CONCAT44(uStack_94,TVar2.enum_);
    if ((TVar2.enum_ == ExternRef) && (this->options_[9] == (WastParseOptions)0x0)) {
      local_a8.offset = (size_t)token.loc.field_1.field_1.offset;
      uStack_a0 = token.loc.field_1._8_8_;
      local_b8 = token.loc.filename.data_;
      sStack_b0 = token.loc.filename.size_;
      format = Type::GetName(&type);
      Error(this,0x1ae79e,format);
      RVar3.enum_ = Error;
    }
    else {
      out_type->enum_ = (Enum)TVar2;
      RVar3.enum_ = Ok;
    }
  }
  else {
    std::__cxx11::string::string((string *)&token,"funcref",&local_b9);
    std::__cxx11::string::string((string *)&token.token_type_,"externref",&local_ba);
    std::__cxx11::string::string(local_38,"exnref",&local_bb);
    _type = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&type,&token,
               &stack0xffffffffffffffe8);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&type,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&type);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::_M_dispose();
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "externref", "exnref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}